

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O2

btVector3 __thiscall btMultiBody::worldPosToLocal(btMultiBody *this,int i,btVector3 *world_pos)

{
  btMultibodyLink *pbVar1;
  undefined1 auVar3 [12];
  undefined8 uVar4;
  btVector3 bVar2;
  btVector3 local_38;
  btVector3 local_28;
  
  if (i == -1) {
    local_38 = operator-(world_pos,&this->m_basePos);
    bVar2 = quatRotate(&this->m_baseQuat,&local_38);
  }
  else {
    pbVar1 = (this->m_links).m_data;
    local_28 = worldPosToLocal(this,pbVar1[i].m_parent,world_pos);
    local_38 = quatRotate(&pbVar1[i].m_cachedRotParentToThis,&local_28);
    bVar2 = operator-(&local_38,&(this->m_links).m_data[i].m_cachedRVector);
  }
  bVar2.m_floats[0] = bVar2.m_floats[0];
  auVar3._4_4_ = bVar2.m_floats[1];
  register0x00001240 = bVar2.m_floats[2];
  register0x00001244 = bVar2.m_floats[3];
  return (btVector3)bVar2.m_floats;
}

Assistant:

btVector3 btMultiBody::worldPosToLocal(int i, const btVector3 &world_pos) const
{
    if (i == -1) {
        // world to base
        return quatRotate(getWorldToBaseRot(),(world_pos - getBasePos()));
    } else {
        // find position in parent frame, then transform to current frame
        return quatRotate(getParentToLocalRot(i),worldPosToLocal(getParent(i), world_pos)) - getRVector(i);
    }
}